

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

bool embree::avx::
     BVHNIntersector1<8,_1048576,_false,_embree::avx::ArrayIntersector1<embree::avx::TriangleMIntersector1Moeller<4,_true>_>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  undefined4 uVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  Geometry *this;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  bool bVar15;
  byte bVar16;
  bool bVar17;
  ulong *puVar18;
  undefined1 (*pauVar19) [16];
  ulong uVar20;
  long lVar21;
  long lVar22;
  uint uVar23;
  undefined1 (*pauVar24) [16];
  ulong uVar25;
  long lVar26;
  byte bVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [16];
  undefined1 auVar61 [32];
  undefined1 auVar60 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [16];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [16];
  undefined1 in_ZMM14 [64];
  undefined1 auVar95 [64];
  undefined1 in_ZMM15 [64];
  undefined1 auVar96 [64];
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2530 [16];
  undefined1 local_2500 [8];
  float fStack_24f8;
  float fStack_24f4;
  float fStack_24f0;
  float fStack_24ec;
  float fStack_24e8;
  float fStack_24e4;
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  float local_24a0;
  float fStack_249c;
  float fStack_2498;
  float fStack_2494;
  float fStack_2490;
  float fStack_248c;
  float fStack_2488;
  float fStack_2484;
  undefined1 local_2480 [32];
  float local_2460;
  float fStack_245c;
  float fStack_2458;
  float fStack_2454;
  float fStack_2450;
  float fStack_244c;
  float fStack_2448;
  float fStack_2444;
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [48];
  undefined8 local_2360 [1126];
  
  local_23a0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_23a0 == 8) {
    return false;
  }
  uStack_2398 = 0;
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    local_2530 = ZEXT416((uint)(query->radius * query->radius));
  }
  else {
    aVar2 = (context->query_radius).field_0;
    local_2530 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
  }
  pauVar24 = (undefined1 (*) [16])local_2390;
  uVar1 = *(undefined4 *)&(query->p).field_0;
  local_23e0._4_4_ = uVar1;
  local_23e0._0_4_ = uVar1;
  local_23e0._8_4_ = uVar1;
  local_23e0._12_4_ = uVar1;
  local_23e0._16_4_ = uVar1;
  local_23e0._20_4_ = uVar1;
  local_23e0._24_4_ = uVar1;
  local_23e0._28_4_ = uVar1;
  auVar91 = ZEXT3264(local_23e0);
  uVar1 = *(undefined4 *)((long)&(query->p).field_0 + 4);
  local_2400._4_4_ = uVar1;
  local_2400._0_4_ = uVar1;
  local_2400._8_4_ = uVar1;
  local_2400._12_4_ = uVar1;
  local_2400._16_4_ = uVar1;
  local_2400._20_4_ = uVar1;
  local_2400._24_4_ = uVar1;
  local_2400._28_4_ = uVar1;
  auVar92 = ZEXT3264(local_2400);
  uVar1 = *(undefined4 *)((long)&(query->p).field_0 + 8);
  local_2420._4_4_ = uVar1;
  local_2420._0_4_ = uVar1;
  local_2420._8_4_ = uVar1;
  local_2420._12_4_ = uVar1;
  local_2420._16_4_ = uVar1;
  local_2420._20_4_ = uVar1;
  local_2420._24_4_ = uVar1;
  local_2420._28_4_ = uVar1;
  auVar93 = ZEXT3264(local_2420);
  uVar1 = *(undefined4 *)&(context->query_radius).field_0;
  auVar34._4_4_ = uVar1;
  auVar34._0_4_ = uVar1;
  auVar34._8_4_ = uVar1;
  auVar34._12_4_ = uVar1;
  auVar34._16_4_ = uVar1;
  auVar34._20_4_ = uVar1;
  auVar34._24_4_ = uVar1;
  auVar34._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
  auVar47._4_4_ = uVar1;
  auVar47._0_4_ = uVar1;
  auVar47._8_4_ = uVar1;
  auVar47._12_4_ = uVar1;
  auVar47._16_4_ = uVar1;
  auVar47._20_4_ = uVar1;
  auVar47._24_4_ = uVar1;
  auVar47._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
  auVar40._4_4_ = uVar1;
  auVar40._0_4_ = uVar1;
  auVar40._8_4_ = uVar1;
  auVar40._12_4_ = uVar1;
  auVar40._16_4_ = uVar1;
  auVar40._20_4_ = uVar1;
  auVar40._24_4_ = uVar1;
  auVar40._28_4_ = uVar1;
  bVar17 = false;
  auVar94 = vpcmpeqd_avx(in_ZMM14._0_16_,in_ZMM14._0_16_);
  auVar95 = ZEXT1664(auVar94);
  do {
    local_2440 = vsubps_avx(auVar91._0_32_,auVar34);
    fVar6 = auVar34._0_4_;
    fVar7 = auVar34._4_4_;
    fVar8 = auVar34._8_4_;
    fVar9 = auVar34._12_4_;
    fVar10 = auVar34._16_4_;
    fVar11 = auVar34._20_4_;
    fVar12 = auVar34._24_4_;
    local_2460 = auVar91._0_4_ + fVar6;
    fStack_245c = auVar91._4_4_ + fVar7;
    fStack_2458 = auVar91._8_4_ + fVar8;
    fStack_2454 = auVar91._12_4_ + fVar9;
    fStack_2450 = auVar91._16_4_ + fVar10;
    fStack_244c = auVar91._20_4_ + fVar11;
    fStack_2448 = auVar91._24_4_ + fVar12;
    fStack_2444 = auVar91._28_4_ + auVar34._28_4_;
    local_2480 = vsubps_avx(auVar92._0_32_,auVar47);
    local_24a0 = auVar92._0_4_ + auVar47._0_4_;
    fStack_249c = auVar92._4_4_ + auVar47._4_4_;
    fStack_2498 = auVar92._8_4_ + auVar47._8_4_;
    fStack_2494 = auVar92._12_4_ + auVar47._12_4_;
    fStack_2490 = auVar92._16_4_ + auVar47._16_4_;
    fStack_248c = auVar92._20_4_ + auVar47._20_4_;
    fStack_2488 = auVar92._24_4_ + auVar47._24_4_;
    fStack_2484 = auVar92._28_4_ + auVar47._28_4_;
    local_24c0 = vsubps_avx(auVar93._0_32_,auVar40);
    local_24e0._0_4_ = auVar93._0_4_ + auVar40._0_4_;
    local_24e0._4_4_ = auVar93._4_4_ + auVar40._4_4_;
    local_24e0._8_4_ = auVar93._8_4_ + auVar40._8_4_;
    local_24e0._12_4_ = auVar93._12_4_ + auVar40._12_4_;
    local_24e0._16_4_ = auVar93._16_4_ + auVar40._16_4_;
    local_24e0._20_4_ = auVar93._20_4_ + auVar40._20_4_;
    local_24e0._24_4_ = auVar93._24_4_ + auVar40._24_4_;
    local_24e0._28_4_ = auVar93._28_4_ + auVar40._28_4_;
    auVar96._0_4_ = fVar6 * fVar6;
    auVar96._4_4_ = fVar7 * fVar7;
    auVar96._8_4_ = fVar8 * fVar8;
    auVar96._12_4_ = fVar9 * fVar9;
    auVar96._16_4_ = fVar10 * fVar10;
    auVar96._20_4_ = fVar11 * fVar11;
    auVar96._28_36_ = in_ZMM15._28_36_;
    auVar96._24_4_ = fVar12 * fVar12;
    in_ZMM15 = ZEXT3264(auVar96._0_32_);
    local_23c0 = auVar96._0_32_;
LAB_00e75dfb:
    do {
      do {
        if (pauVar24 == (undefined1 (*) [16])&local_23a0) {
          return bVar17;
        }
        pauVar19 = pauVar24 + -1;
        pauVar24 = pauVar24 + -1;
      } while ((float)local_2530._0_4_ < *(float *)(*pauVar19 + 8));
      uVar20 = *(ulong *)*pauVar24;
LAB_00e75e21:
      auVar94 = auVar95._0_16_;
      auVar34 = auVar91._0_32_;
      auVar40 = auVar92._0_32_;
      auVar47 = auVar93._0_32_;
      if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
        if ((uVar20 & 8) != 0) goto LAB_00e764a7;
        puVar18 = (ulong *)((uVar20 & 0xfffffffffffffff0) + 0x40);
        if ((uVar20 & 0xfffffffffffffff0) == 0) {
          puVar18 = (ulong *)0x0;
        }
        fVar6 = *(float *)(puVar18 + 6);
        fVar7 = *(float *)((long)puVar18 + 0x3c);
        auVar36._8_8_ = 0;
        auVar36._0_8_ = *puVar18;
        auVar30 = vpmovzxbd_avx(auVar36);
        auVar28._8_8_ = 0;
        auVar28._0_8_ = *(ulong *)((long)puVar18 + 4);
        auVar38 = vpmovzxbd_avx(auVar28);
        auVar48._16_16_ = auVar38;
        auVar48._0_16_ = auVar30;
        auVar13 = vcvtdq2ps_avx(auVar48);
        auVar56._0_4_ = fVar6 + fVar7 * auVar13._0_4_;
        auVar56._4_4_ = fVar6 + fVar7 * auVar13._4_4_;
        auVar56._8_4_ = fVar6 + fVar7 * auVar13._8_4_;
        auVar56._12_4_ = fVar6 + fVar7 * auVar13._12_4_;
        auVar56._16_4_ = fVar6 + fVar7 * auVar13._16_4_;
        auVar56._20_4_ = fVar6 + fVar7 * auVar13._20_4_;
        auVar56._24_4_ = fVar6 + fVar7 * auVar13._24_4_;
        auVar56._28_4_ = fVar6 + auVar13._28_4_;
        auVar51._8_8_ = 0;
        auVar51._0_8_ = puVar18[1];
        auVar30 = vpmovzxbd_avx(auVar51);
        auVar43._8_8_ = 0;
        auVar43._0_8_ = *(ulong *)((long)puVar18 + 0xc);
        auVar38 = vpmovzxbd_avx(auVar43);
        auVar74._16_16_ = auVar38;
        auVar74._0_16_ = auVar30;
        auVar13 = vcvtdq2ps_avx(auVar74);
        auVar61._0_4_ = fVar6 + fVar7 * auVar13._0_4_;
        auVar61._4_4_ = fVar6 + fVar7 * auVar13._4_4_;
        auVar61._8_4_ = fVar6 + fVar7 * auVar13._8_4_;
        auVar61._12_4_ = fVar6 + fVar7 * auVar13._12_4_;
        auVar61._16_4_ = fVar6 + fVar7 * auVar13._16_4_;
        auVar61._20_4_ = fVar6 + fVar7 * auVar13._20_4_;
        auVar61._24_4_ = fVar6 + fVar7 * auVar13._24_4_;
        auVar61._28_4_ = fVar6 + fVar7;
        fVar6 = *(float *)((long)puVar18 + 0x34);
        fVar7 = *(float *)(puVar18 + 8);
        auVar64._8_8_ = 0;
        auVar64._0_8_ = puVar18[2];
        auVar30 = vpmovzxbd_avx(auVar64);
        auVar82._8_8_ = 0;
        auVar82._0_8_ = *(ulong *)((long)puVar18 + 0x14);
        auVar38 = vpmovzxbd_avx(auVar82);
        auVar67._16_16_ = auVar38;
        auVar67._0_16_ = auVar30;
        auVar13 = vcvtdq2ps_avx(auVar67);
        auVar68._0_4_ = fVar6 + fVar7 * auVar13._0_4_;
        auVar68._4_4_ = fVar6 + fVar7 * auVar13._4_4_;
        auVar68._8_4_ = fVar6 + fVar7 * auVar13._8_4_;
        auVar68._12_4_ = fVar6 + fVar7 * auVar13._12_4_;
        auVar68._16_4_ = fVar6 + fVar7 * auVar13._16_4_;
        auVar68._20_4_ = fVar6 + fVar7 * auVar13._20_4_;
        auVar68._24_4_ = fVar6 + fVar7 * auVar13._24_4_;
        auVar68._28_4_ = fVar6 + auVar13._28_4_;
        auVar83._8_8_ = 0;
        auVar83._0_8_ = puVar18[3];
        auVar30 = vpmovzxbd_avx(auVar83);
        auVar89._8_8_ = 0;
        auVar89._0_8_ = *(ulong *)((long)puVar18 + 0x1c);
        auVar38 = vpmovzxbd_avx(auVar89);
        auVar86._16_16_ = auVar38;
        auVar86._0_16_ = auVar30;
        auVar13 = vcvtdq2ps_avx(auVar86);
        auVar75._0_4_ = fVar7 * auVar13._0_4_ + fVar6;
        auVar75._4_4_ = fVar7 * auVar13._4_4_ + fVar6;
        auVar75._8_4_ = fVar7 * auVar13._8_4_ + fVar6;
        auVar75._12_4_ = fVar7 * auVar13._12_4_ + fVar6;
        auVar75._16_4_ = fVar7 * auVar13._16_4_ + fVar6;
        auVar75._20_4_ = fVar7 * auVar13._20_4_ + fVar6;
        auVar75._24_4_ = fVar7 * auVar13._24_4_ + fVar6;
        auVar75._28_4_ = fVar7 + fVar6;
        auVar77._8_8_ = 0;
        auVar77._0_8_ = puVar18[4];
        auVar30 = vpmovzxbd_avx(auVar77);
        auVar84._8_8_ = 0;
        auVar84._0_8_ = *(ulong *)((long)puVar18 + 0x24);
        auVar38 = vpmovzxbd_avx(auVar84);
        auVar79._16_16_ = auVar38;
        auVar79._0_16_ = auVar30;
        auVar85._8_8_ = 0;
        auVar85._0_8_ = puVar18[5];
        auVar30 = vpmovzxbd_avx(auVar85);
        auVar90._8_8_ = 0;
        auVar90._0_8_ = *(ulong *)((long)puVar18 + 0x2c);
        auVar38 = vpmovzxbd_avx(auVar90);
        auVar87._16_16_ = auVar38;
        auVar87._0_16_ = auVar30;
        fVar6 = *(float *)((long)puVar18 + 0x44);
        auVar13 = vcvtdq2ps_avx(auVar79);
        auVar14 = vcvtdq2ps_avx(auVar87);
        fVar7 = *(float *)(puVar18 + 7);
        auVar80._0_4_ = fVar7 + fVar6 * auVar13._0_4_;
        auVar80._4_4_ = fVar7 + fVar6 * auVar13._4_4_;
        auVar80._8_4_ = fVar7 + fVar6 * auVar13._8_4_;
        auVar80._12_4_ = fVar7 + fVar6 * auVar13._12_4_;
        auVar80._16_4_ = fVar7 + fVar6 * auVar13._16_4_;
        auVar80._20_4_ = fVar7 + fVar6 * auVar13._20_4_;
        auVar80._24_4_ = fVar7 + fVar6 * auVar13._24_4_;
        auVar80._28_4_ = fVar7 + auVar13._28_4_;
        auVar88._0_4_ = fVar7 + fVar6 * auVar14._0_4_;
        auVar88._4_4_ = fVar7 + fVar6 * auVar14._4_4_;
        auVar88._8_4_ = fVar7 + fVar6 * auVar14._8_4_;
        auVar88._12_4_ = fVar7 + fVar6 * auVar14._12_4_;
        auVar88._16_4_ = fVar7 + fVar6 * auVar14._16_4_;
        auVar88._20_4_ = fVar7 + fVar6 * auVar14._20_4_;
        auVar88._24_4_ = fVar7 + fVar6 * auVar14._24_4_;
        auVar88._28_4_ = fVar7 + auVar14._28_4_;
        auVar13 = vmaxps_avx(auVar40,auVar68);
        auVar14 = vminps_avx(auVar13,auVar75);
        auVar13 = vmaxps_avx(auVar47,auVar80);
        auVar35 = vminps_avx(auVar13,auVar88);
        auVar13 = vmaxps_avx(auVar34,auVar56);
        auVar13 = vminps_avx(auVar13,auVar61);
        auVar34 = vsubps_avx(auVar13,auVar34);
        auVar40 = vsubps_avx(auVar14,auVar40);
        auVar47 = vsubps_avx(auVar35,auVar47);
        local_2500._0_4_ =
             auVar34._0_4_ * auVar34._0_4_ + auVar40._0_4_ * auVar40._0_4_ +
             auVar47._0_4_ * auVar47._0_4_;
        local_2500._4_4_ =
             auVar34._4_4_ * auVar34._4_4_ + auVar40._4_4_ * auVar40._4_4_ +
             auVar47._4_4_ * auVar47._4_4_;
        fStack_24f8 = auVar34._8_4_ * auVar34._8_4_ + auVar40._8_4_ * auVar40._8_4_ +
                      auVar47._8_4_ * auVar47._8_4_;
        fStack_24f4 = auVar34._12_4_ * auVar34._12_4_ + auVar40._12_4_ * auVar40._12_4_ +
                      auVar47._12_4_ * auVar47._12_4_;
        fStack_24f0 = auVar34._16_4_ * auVar34._16_4_ + auVar40._16_4_ * auVar40._16_4_ +
                      auVar47._16_4_ * auVar47._16_4_;
        fStack_24ec = auVar34._20_4_ * auVar34._20_4_ + auVar40._20_4_ * auVar40._20_4_ +
                      auVar47._20_4_ * auVar47._20_4_;
        fStack_24e8 = auVar34._24_4_ * auVar34._24_4_ + auVar40._24_4_ * auVar40._24_4_ +
                      auVar47._24_4_ * auVar47._24_4_;
        fStack_24e4 = auVar34._28_4_ + auVar40._28_4_ + auVar47._28_4_;
        auVar34 = vcmpps_avx(auVar56,auVar61,2);
        auVar40 = vcmpps_avx(_local_2500,in_ZMM15._0_32_,2);
        auVar34 = vandps_avx(auVar34,auVar40);
        auVar30 = vpminub_avx(auVar36,auVar51);
        auVar37._8_8_ = 0;
        auVar37._0_8_ = *puVar18;
        auVar38 = vpcmpeqb_avx(auVar37,auVar30);
        auVar30 = vpminub_avx(auVar28,auVar43);
        auVar29._8_8_ = 0;
        auVar29._0_8_ = *(ulong *)((long)puVar18 + 4);
        auVar30 = vpcmpeqb_avx(auVar29,auVar30);
        auVar30 = vpmovsxbd_avx(auVar94 ^ auVar30);
        auVar30 = vpsrad_avx(auVar30,0x1f);
        auVar30 = vpandn_avx(auVar30,auVar34._16_16_);
        auVar38 = vpmovsxbd_avx(auVar94 ^ auVar38);
        auVar38 = vpsrad_avx(auVar38,0x1f);
        auVar38 = vpandn_avx(auVar38,auVar34._0_16_);
        auVar30 = vpackssdw_avx(auVar38,auVar30);
LAB_00e75fe9:
        auVar30 = vpsllw_avx(auVar30,0xf);
        if ((((((((auVar30 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar30 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar30 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar30 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar30 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar30 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar30 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar30[0xf] < '\0') {
          auVar30 = vpacksswb_avx(auVar30,auVar30);
          bVar16 = SUB161(auVar30 >> 7,0) & 1 | (SUB161(auVar30 >> 0xf,0) & 1) << 1 |
                   (SUB161(auVar30 >> 0x17,0) & 1) << 2 | (SUB161(auVar30 >> 0x1f,0) & 1) << 3 |
                   (SUB161(auVar30 >> 0x27,0) & 1) << 4 | (SUB161(auVar30 >> 0x2f,0) & 1) << 5 |
                   (SUB161(auVar30 >> 0x37,0) & 1) << 6 | SUB161(auVar30 >> 0x3f,0) << 7;
          uVar25 = uVar20 & 0xfffffffffffffff0;
          lVar21 = 0;
          if (bVar16 != 0) {
            for (; (bVar16 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
            }
          }
          uVar20 = *(ulong *)(uVar25 + lVar21 * 8);
          uVar23 = bVar16 - 1 & (uint)bVar16;
          if (uVar23 != 0) {
            uVar3 = *(uint *)(local_2500 + lVar21 * 4);
            lVar21 = 0;
            if (uVar23 != 0) {
              for (; (uVar23 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
              }
            }
            uVar5 = *(ulong *)(uVar25 + lVar21 * 8);
            uVar4 = *(uint *)(local_2500 + lVar21 * 4);
            uVar23 = uVar23 - 1 & uVar23;
            if (uVar23 == 0) {
              if (uVar3 < uVar4) {
                *(ulong *)*pauVar24 = uVar5;
                *(uint *)(*pauVar24 + 8) = uVar4;
                pauVar24 = pauVar24 + 1;
              }
              else {
                *(ulong *)*pauVar24 = uVar20;
                *(uint *)(*pauVar24 + 8) = uVar3;
                pauVar24 = pauVar24 + 1;
                uVar20 = uVar5;
              }
            }
            else {
              auVar32._8_8_ = 0;
              auVar32._0_8_ = uVar20;
              auVar30 = vpunpcklqdq_avx(auVar32,ZEXT416(uVar3));
              auVar39._8_8_ = 0;
              auVar39._0_8_ = uVar5;
              auVar38 = vpunpcklqdq_avx(auVar39,ZEXT416(uVar4));
              lVar21 = 0;
              if (uVar23 != 0) {
                for (; (uVar23 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
                }
              }
              auVar46._8_8_ = 0;
              auVar46._0_8_ = *(ulong *)(uVar25 + lVar21 * 8);
              auVar44 = vpunpcklqdq_avx(auVar46,ZEXT416(*(uint *)(local_2500 + lVar21 * 4)));
              auVar31 = vpcmpgtd_avx(auVar38,auVar30);
              uVar23 = uVar23 - 1 & uVar23;
              if (uVar23 == 0) {
                auVar31 = vpshufd_avx(auVar31,0xaa);
                auVar94 = vblendvps_avx(auVar38,auVar30,auVar31);
                auVar30 = vblendvps_avx(auVar30,auVar38,auVar31);
                auVar38 = vpcmpgtd_avx(auVar44,auVar94);
                auVar31 = vpshufd_avx(auVar38,0xaa);
                auVar38 = vblendvps_avx(auVar44,auVar94,auVar31);
                auVar94 = vblendvps_avx(auVar94,auVar44,auVar31);
                auVar31 = vpcmpgtd_avx(auVar94,auVar30);
                auVar44 = vpshufd_avx(auVar31,0xaa);
                auVar31 = vblendvps_avx(auVar94,auVar30,auVar44);
                auVar94 = vblendvps_avx(auVar30,auVar94,auVar44);
                *pauVar24 = auVar94;
                pauVar24[1] = auVar31;
                uVar20 = auVar38._0_8_;
                pauVar24 = pauVar24 + 2;
              }
              else {
                lVar21 = 0;
                if (uVar23 != 0) {
                  for (; (uVar23 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
                  }
                }
                auVar55._8_8_ = 0;
                auVar55._0_8_ = *(ulong *)(uVar25 + lVar21 * 8);
                auVar45 = vpunpcklqdq_avx(auVar55,ZEXT416(*(uint *)(local_2500 + lVar21 * 4)));
                uVar23 = uVar23 - 1 & uVar23;
                uVar20 = (ulong)uVar23;
                if (uVar23 == 0) {
                  auVar31 = vpshufd_avx(auVar31,0xaa);
                  auVar94 = vblendvps_avx(auVar38,auVar30,auVar31);
                  auVar30 = vblendvps_avx(auVar30,auVar38,auVar31);
                  auVar38 = vpcmpgtd_avx(auVar45,auVar44);
                  auVar31 = vpshufd_avx(auVar38,0xaa);
                  auVar38 = vblendvps_avx(auVar45,auVar44,auVar31);
                  auVar31 = vblendvps_avx(auVar44,auVar45,auVar31);
                  auVar44 = vpcmpgtd_avx(auVar31,auVar30);
                  auVar45 = vpshufd_avx(auVar44,0xaa);
                  auVar44 = vblendvps_avx(auVar31,auVar30,auVar45);
                  auVar30 = vblendvps_avx(auVar30,auVar31,auVar45);
                  auVar31 = vpcmpgtd_avx(auVar38,auVar94);
                  auVar45 = vpshufd_avx(auVar31,0xaa);
                  auVar31 = vblendvps_avx(auVar38,auVar94,auVar45);
                  auVar94 = vblendvps_avx(auVar94,auVar38,auVar45);
                  auVar38 = vpcmpgtd_avx(auVar44,auVar94);
                  auVar45 = vpshufd_avx(auVar38,0xaa);
                  auVar38 = vblendvps_avx(auVar44,auVar94,auVar45);
                  auVar94 = vblendvps_avx(auVar94,auVar44,auVar45);
                  *pauVar24 = auVar30;
                  pauVar24[1] = auVar94;
                  pauVar24[2] = auVar38;
                  uVar20 = auVar31._0_8_;
                  pauVar24 = pauVar24 + 3;
                }
                else {
                  *pauVar24 = auVar30;
                  pauVar24[1] = auVar38;
                  pauVar24[2] = auVar44;
                  pauVar19 = pauVar24 + 3;
                  pauVar24[3] = auVar45;
                  do {
                    lVar21 = 0;
                    if (uVar20 != 0) {
                      for (; (uVar20 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
                      }
                    }
                    auVar33._8_8_ = 0;
                    auVar33._0_8_ = *(ulong *)(uVar25 + lVar21 * 8);
                    auVar30 = vpunpcklqdq_avx(auVar33,ZEXT416(*(uint *)(local_2500 + lVar21 * 4)));
                    pauVar19[1] = auVar30;
                    pauVar19 = pauVar19 + 1;
                    uVar20 = uVar20 & uVar20 - 1;
                  } while (uVar20 != 0);
                  lVar21 = 0;
                  while (pauVar19 != pauVar24) {
                    auVar30 = pauVar24[1];
                    uVar23 = vextractps_avx(auVar30,2);
                    for (lVar22 = 0x10;
                        (lVar21 != lVar22 && (*(uint *)(pauVar24[-1] + lVar22 + 8) < uVar23));
                        lVar22 = lVar22 + -0x10) {
                      *(undefined1 (*) [16])(*pauVar24 + lVar22) =
                           *(undefined1 (*) [16])(pauVar24[-1] + lVar22);
                    }
                    *(undefined1 (*) [16])(*pauVar24 + lVar22) = auVar30;
                    lVar21 = lVar21 + -0x10;
                    pauVar24 = pauVar24 + 1;
                  }
                  uVar20 = *(ulong *)*pauVar19;
                  auVar94 = vpcmpeqd_avx(auVar94,auVar94);
                  auVar95 = ZEXT1664(auVar94);
                  pauVar24 = pauVar19;
                }
              }
            }
          }
          goto LAB_00e75e21;
        }
        goto LAB_00e75dfb;
      }
      if ((uVar20 & 8) == 0) {
        puVar18 = (ulong *)((uVar20 & 0xfffffffffffffff0) + 0x40);
        if ((uVar20 & 0xfffffffffffffff0) == 0) {
          puVar18 = (ulong *)0x0;
        }
        auVar31._8_8_ = 0;
        auVar31._0_8_ = *puVar18;
        auVar30 = vpmovzxbd_avx(auVar31);
        auVar44._8_8_ = 0;
        auVar44._0_8_ = *(ulong *)((long)puVar18 + 4);
        auVar38 = vpmovzxbd_avx(auVar44);
        auVar41._16_16_ = auVar38;
        auVar41._0_16_ = auVar30;
        auVar52._8_8_ = 0;
        auVar52._0_8_ = puVar18[1];
        auVar30 = vpmovzxbd_avx(auVar52);
        auVar59._8_8_ = 0;
        auVar59._0_8_ = *(ulong *)((long)puVar18 + 0xc);
        auVar38 = vpmovzxbd_avx(auVar59);
        auVar57._16_16_ = auVar38;
        auVar57._0_16_ = auVar30;
        auVar30 = vpminub_avx(auVar31,auVar52);
        auVar38._8_8_ = 0;
        auVar38._0_8_ = *puVar18;
        auVar30 = vpcmpeqb_avx(auVar38,auVar30);
        auVar38 = vpmovsxbd_avx(auVar94 ^ auVar30);
        auVar30 = vpminub_avx(auVar44,auVar59);
        auVar45._8_8_ = 0;
        auVar45._0_8_ = *(ulong *)((long)puVar18 + 4);
        auVar30 = vpcmpeqb_avx(auVar45,auVar30);
        auVar30 = vpmovsxbd_avx(auVar94 ^ auVar30);
        auVar35._16_16_ = auVar30;
        auVar35._0_16_ = auVar38;
        fVar6 = *(float *)(puVar18 + 6);
        fVar7 = *(float *)((long)puVar18 + 0x3c);
        auVar13 = vcvtdq2ps_avx(auVar41);
        auVar42._0_4_ = fVar6 + fVar7 * auVar13._0_4_;
        auVar42._4_4_ = fVar6 + fVar7 * auVar13._4_4_;
        auVar42._8_4_ = fVar6 + fVar7 * auVar13._8_4_;
        auVar42._12_4_ = fVar6 + fVar7 * auVar13._12_4_;
        auVar42._16_4_ = fVar6 + fVar7 * auVar13._16_4_;
        auVar42._20_4_ = fVar6 + fVar7 * auVar13._20_4_;
        auVar42._24_4_ = fVar6 + fVar7 * auVar13._24_4_;
        auVar42._28_4_ = fVar6 + auVar13._28_4_;
        auVar13 = vcvtdq2ps_avx(auVar57);
        auVar49._0_4_ = fVar6 + fVar7 * auVar13._0_4_;
        auVar49._4_4_ = fVar6 + fVar7 * auVar13._4_4_;
        auVar49._8_4_ = fVar6 + fVar7 * auVar13._8_4_;
        auVar49._12_4_ = fVar6 + fVar7 * auVar13._12_4_;
        auVar49._16_4_ = fVar6 + fVar7 * auVar13._16_4_;
        auVar49._20_4_ = fVar6 + fVar7 * auVar13._20_4_;
        auVar49._24_4_ = fVar6 + fVar7 * auVar13._24_4_;
        auVar49._28_4_ = fVar6 + fVar7;
        fVar6 = *(float *)((long)puVar18 + 0x34);
        fVar7 = *(float *)(puVar18 + 8);
        auVar30._8_8_ = 0;
        auVar30._0_8_ = puVar18[2];
        auVar30 = vpmovzxbd_avx(auVar30);
        auVar65._8_8_ = 0;
        auVar65._0_8_ = *(ulong *)((long)puVar18 + 0x14);
        auVar38 = vpmovzxbd_avx(auVar65);
        auVar53._16_16_ = auVar38;
        auVar53._0_16_ = auVar30;
        auVar13 = vcvtdq2ps_avx(auVar53);
        auVar54._0_4_ = fVar6 + fVar7 * auVar13._0_4_;
        auVar54._4_4_ = fVar6 + fVar7 * auVar13._4_4_;
        auVar54._8_4_ = fVar6 + fVar7 * auVar13._8_4_;
        auVar54._12_4_ = fVar6 + fVar7 * auVar13._12_4_;
        auVar54._16_4_ = fVar6 + fVar7 * auVar13._16_4_;
        auVar54._20_4_ = fVar6 + fVar7 * auVar13._20_4_;
        auVar54._24_4_ = fVar6 + fVar7 * auVar13._24_4_;
        auVar54._28_4_ = fVar6 + auVar13._28_4_;
        auVar66._8_8_ = 0;
        auVar66._0_8_ = puVar18[3];
        auVar30 = vpmovzxbd_avx(auVar66);
        auVar71._8_8_ = 0;
        auVar71._0_8_ = *(ulong *)((long)puVar18 + 0x1c);
        auVar38 = vpmovzxbd_avx(auVar71);
        auVar69._16_16_ = auVar38;
        auVar69._0_16_ = auVar30;
        auVar13 = vcvtdq2ps_avx(auVar69);
        auVar58._0_4_ = fVar6 + fVar7 * auVar13._0_4_;
        auVar58._4_4_ = fVar6 + fVar7 * auVar13._4_4_;
        auVar58._8_4_ = fVar6 + fVar7 * auVar13._8_4_;
        auVar58._12_4_ = fVar6 + fVar7 * auVar13._12_4_;
        auVar58._16_4_ = fVar6 + fVar7 * auVar13._16_4_;
        auVar58._20_4_ = fVar6 + fVar7 * auVar13._20_4_;
        auVar58._24_4_ = fVar6 + fVar7 * auVar13._24_4_;
        auVar58._28_4_ = fVar6 + fVar7;
        fVar6 = *(float *)(puVar18 + 7);
        auVar60._8_8_ = 0;
        auVar60._0_8_ = puVar18[4];
        auVar30 = vpmovzxbd_avx(auVar60);
        auVar72._8_8_ = 0;
        auVar72._0_8_ = *(ulong *)((long)puVar18 + 0x24);
        auVar38 = vpmovzxbd_avx(auVar72);
        auVar62._16_16_ = auVar38;
        auVar62._0_16_ = auVar30;
        auVar73._8_8_ = 0;
        auVar73._0_8_ = puVar18[5];
        auVar30 = vpmovzxbd_avx(auVar73);
        auVar78._8_8_ = 0;
        auVar78._0_8_ = *(ulong *)((long)puVar18 + 0x2c);
        auVar38 = vpmovzxbd_avx(auVar78);
        auVar76._16_16_ = auVar38;
        auVar76._0_16_ = auVar30;
        fVar7 = *(float *)((long)puVar18 + 0x44);
        auVar13 = vcvtdq2ps_avx(auVar62);
        auVar63._0_4_ = fVar6 + fVar7 * auVar13._0_4_;
        auVar63._4_4_ = fVar6 + fVar7 * auVar13._4_4_;
        auVar63._8_4_ = fVar6 + fVar7 * auVar13._8_4_;
        auVar63._12_4_ = fVar6 + fVar7 * auVar13._12_4_;
        auVar63._16_4_ = fVar6 + fVar7 * auVar13._16_4_;
        auVar63._20_4_ = fVar6 + fVar7 * auVar13._20_4_;
        auVar63._24_4_ = fVar6 + fVar7 * auVar13._24_4_;
        auVar63._28_4_ = fVar6 + auVar13._28_4_;
        auVar13 = vcvtdq2ps_avx(auVar76);
        auVar70._0_4_ = fVar6 + fVar7 * auVar13._0_4_;
        auVar70._4_4_ = fVar6 + fVar7 * auVar13._4_4_;
        auVar70._8_4_ = fVar6 + fVar7 * auVar13._8_4_;
        auVar70._12_4_ = fVar6 + fVar7 * auVar13._12_4_;
        auVar70._16_4_ = fVar6 + fVar7 * auVar13._16_4_;
        auVar70._20_4_ = fVar6 + fVar7 * auVar13._20_4_;
        auVar70._24_4_ = fVar6 + fVar7 * auVar13._24_4_;
        auVar70._28_4_ = fVar6 + auVar13._28_4_;
        auVar13 = vmaxps_avx(auVar34,auVar42);
        auVar13 = vminps_avx(auVar13,auVar49);
        auVar13 = vsubps_avx(auVar13,auVar34);
        auVar34 = vmaxps_avx(auVar40,auVar54);
        auVar34 = vminps_avx(auVar34,auVar58);
        auVar40 = vsubps_avx(auVar34,auVar40);
        auVar34 = vmaxps_avx(auVar47,auVar63);
        auVar34 = vminps_avx(auVar34,auVar70);
        auVar47 = vsubps_avx(auVar34,auVar47);
        auVar34 = vcvtdq2ps_avx(auVar35);
        auVar81._8_4_ = 0xbf800000;
        auVar81._0_8_ = 0xbf800000bf800000;
        auVar81._12_4_ = 0xbf800000;
        auVar81._16_4_ = 0xbf800000;
        auVar81._20_4_ = 0xbf800000;
        auVar81._24_4_ = 0xbf800000;
        auVar81._28_4_ = 0xbf800000;
        auVar34 = vcmpps_avx(auVar81,auVar34,1);
        local_2500._4_4_ =
             auVar47._4_4_ * auVar47._4_4_ +
             auVar40._4_4_ * auVar40._4_4_ + auVar13._4_4_ * auVar13._4_4_;
        local_2500._0_4_ =
             auVar47._0_4_ * auVar47._0_4_ +
             auVar40._0_4_ * auVar40._0_4_ + auVar13._0_4_ * auVar13._0_4_;
        fStack_24f8 = auVar47._8_4_ * auVar47._8_4_ +
                      auVar40._8_4_ * auVar40._8_4_ + auVar13._8_4_ * auVar13._8_4_;
        fStack_24f4 = auVar47._12_4_ * auVar47._12_4_ +
                      auVar40._12_4_ * auVar40._12_4_ + auVar13._12_4_ * auVar13._12_4_;
        fStack_24f0 = auVar47._16_4_ * auVar47._16_4_ +
                      auVar40._16_4_ * auVar40._16_4_ + auVar13._16_4_ * auVar13._16_4_;
        fStack_24ec = auVar47._20_4_ * auVar47._20_4_ +
                      auVar40._20_4_ * auVar40._20_4_ + auVar13._20_4_ * auVar13._20_4_;
        fStack_24e8 = auVar47._24_4_ * auVar47._24_4_ +
                      auVar40._24_4_ * auVar40._24_4_ + auVar13._24_4_ * auVar13._24_4_;
        fStack_24e4 = auVar47._28_4_ + auVar40._28_4_ + auVar13._28_4_;
        auVar40 = vcmpps_avx(auVar49,local_2440,5);
        auVar34 = vandps_avx(auVar40,auVar34);
        auVar40 = vcmpps_avx(auVar42,auVar49,2);
        auVar14._4_4_ = fStack_245c;
        auVar14._0_4_ = local_2460;
        auVar14._8_4_ = fStack_2458;
        auVar14._12_4_ = fStack_2454;
        auVar14._16_4_ = fStack_2450;
        auVar14._20_4_ = fStack_244c;
        auVar14._24_4_ = fStack_2448;
        auVar14._28_4_ = fStack_2444;
        auVar47 = vcmpps_avx(auVar42,auVar14,2);
        auVar40 = vandps_avx(auVar47,auVar40);
        auVar34 = vandps_avx(auVar40,auVar34);
        auVar40 = vcmpps_avx(auVar58,local_2480,5);
        auVar13._4_4_ = fStack_249c;
        auVar13._0_4_ = local_24a0;
        auVar13._8_4_ = fStack_2498;
        auVar13._12_4_ = fStack_2494;
        auVar13._16_4_ = fStack_2490;
        auVar13._20_4_ = fStack_248c;
        auVar13._24_4_ = fStack_2488;
        auVar13._28_4_ = fStack_2484;
        auVar47 = vcmpps_avx(auVar54,auVar13,2);
        auVar40 = vandps_avx(auVar47,auVar40);
        auVar47 = vcmpps_avx(auVar63,local_24e0,2);
        auVar40 = vandps_avx(auVar40,auVar47);
        auVar34 = vandps_avx(auVar34,auVar40);
        auVar40 = vcmpps_avx(auVar70,local_24c0,5);
        auVar50._8_4_ = 0xffff;
        auVar50._0_8_ = 0xffff0000ffff;
        auVar50._12_4_ = 0xffff;
        auVar50._16_4_ = 0xffff;
        auVar50._20_4_ = 0xffff;
        auVar50._24_4_ = 0xffff;
        auVar50._28_4_ = 0xffff;
        auVar40 = vandps_avx(auVar40,auVar50);
        auVar34 = vandps_avx(auVar34,auVar40);
        auVar30 = vpackusdw_avx(auVar34._0_16_,auVar34._16_16_);
        goto LAB_00e75fe9;
      }
LAB_00e764a7:
      lVar22 = (uVar20 & 0xfffffffffffffff0) + 0xa0;
      bVar16 = 0;
      lVar21 = 0;
      while (lVar21 != (ulong)((uint)uVar20 & 0xf) - 8) {
        bVar27 = 0;
        for (lVar26 = -0x10; auVar94 = auVar95._0_16_, lVar26 != 0; lVar26 = lVar26 + 4) {
          uVar23 = *(uint *)(lVar22 + lVar26);
          if ((ulong)uVar23 == 0xffffffff) break;
          this = (context->scene->geometries).items[uVar23].ptr;
          context->geomID = uVar23;
          context->primID = *(uint *)(lVar22 + 0x10 + lVar26);
          auVar95 = ZEXT1664(auVar94);
          bVar15 = Geometry::pointQuery(this,query,context);
          in_ZMM15 = ZEXT3264(local_23c0);
          auVar93 = ZEXT3264(local_2420);
          auVar92 = ZEXT3264(local_2400);
          auVar91 = ZEXT3264(local_23e0);
          bVar27 = bVar27 | bVar15;
        }
        bVar16 = bVar16 | bVar27;
        lVar21 = lVar21 + 1;
        lVar22 = lVar22 + 0xb0;
        auVar94 = vpcmpeqd_avx(auVar94,auVar94);
        auVar95 = ZEXT1664(auVar94);
      }
    } while (bVar16 == 0);
    uVar1 = *(undefined4 *)&(context->query_radius).field_0;
    auVar34._4_4_ = uVar1;
    auVar34._0_4_ = uVar1;
    auVar34._8_4_ = uVar1;
    auVar34._12_4_ = uVar1;
    auVar34._16_4_ = uVar1;
    auVar34._20_4_ = uVar1;
    auVar34._24_4_ = uVar1;
    auVar34._28_4_ = uVar1;
    uVar1 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
    auVar47._4_4_ = uVar1;
    auVar47._0_4_ = uVar1;
    auVar47._8_4_ = uVar1;
    auVar47._12_4_ = uVar1;
    auVar47._16_4_ = uVar1;
    auVar47._20_4_ = uVar1;
    auVar47._24_4_ = uVar1;
    auVar47._28_4_ = uVar1;
    uVar1 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
    auVar40._4_4_ = uVar1;
    auVar40._0_4_ = uVar1;
    auVar40._8_4_ = uVar1;
    auVar40._12_4_ = uVar1;
    auVar40._16_4_ = uVar1;
    auVar40._20_4_ = uVar1;
    auVar40._24_4_ = uVar1;
    auVar40._28_4_ = uVar1;
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      local_2530 = ZEXT416((uint)(query->radius * query->radius));
    }
    else {
      aVar2 = (context->query_radius).field_0;
      local_2530 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
    }
    bVar17 = true;
  } while( true );
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }